

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaO_rawequalObj(TValue *t1,TValue *t2)

{
  bool bVar1;
  
  if (t1->tt == t2->tt) {
    switch(t1->tt) {
    case 0:
      return 1;
    case 1:
      bVar1 = (t1->value).b == (t2->value).b;
      break;
    default:
      bVar1 = (t1->value).gc == (t2->value).gc;
      break;
    case 3:
      return -(uint)((t2->value).n == (t1->value).n) & 1;
    }
    return (uint)bVar1;
  }
  return 0;
}

Assistant:

static int luaO_rawequalObj(const TValue*t1,const TValue*t2){
if(ttype(t1)!=ttype(t2))return 0;
else switch(ttype(t1)){
case 0:
return 1;
case 3:
return luai_numeq(nvalue(t1),nvalue(t2));
case 1:
return bvalue(t1)==bvalue(t2);
case 2:
return pvalue(t1)==pvalue(t2);
default:
return gcvalue(t1)==gcvalue(t2);
}
}